

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int lua_resume(lua_State *L,lua_State *from,int nargs,int *nresults)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  anon_union_4_3_18ab96e6_for_u2 aVar4;
  TString *pTVar5;
  CallInfo *pCVar6;
  uint uVar7;
  char *pcVar8;
  TValue *io_2;
  StkId pSVar9;
  StkId pSVar10;
  TValue *io;
  undefined1 local_34 [4];
  
  if (L->status != '\x01') {
    if (L->status == '\0') {
      pSVar10 = (L->top).p;
      if (L->ci == &L->base_ci) {
        if ((long)pSVar10 + (-0x10 - (L->ci->func).offset) >> 4 != (long)nargs) goto LAB_0010ca48;
        pSVar10 = pSVar10 + -(long)nargs;
        (L->top).p = pSVar10;
        pcVar8 = "cannot resume dead coroutine";
      }
      else {
        pSVar10 = pSVar10 + -(long)nargs;
        (L->top).p = pSVar10;
        pcVar8 = "cannot resume non-suspended coroutine";
      }
      pTVar5 = luaS_new(L,pcVar8);
      *(TString **)pSVar10 = pTVar5;
      (pSVar10->val).tt_ = pTVar5->tt | 0x40;
      goto LAB_0010ca96;
    }
    pSVar10 = (L->top).p;
    pSVar9 = pSVar10 + -(long)nargs;
    (L->top).p = pSVar9;
    pcVar8 = "cannot resume dead coroutine";
LAB_0010ca7d:
    pTVar5 = luaS_new(L,pcVar8);
    *(TString **)pSVar9 = pTVar5;
    *(byte *)((long)pSVar10 + (long)nargs * -0x10 + 8) = pTVar5->tt | 0x40;
LAB_0010ca96:
    (L->top).p = (StkId)((L->top).offset + 0x10);
    return 2;
  }
LAB_0010ca48:
  if (from == (lua_State *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar1 = (ushort)from->nCcalls;
    uVar7 = (uint)uVar1;
    L->nCcalls = (uint)uVar1;
    if (199 < uVar1) {
      pSVar10 = (L->top).p;
      pSVar9 = pSVar10 + -(long)nargs;
      (L->top).p = pSVar9;
      pcVar8 = "C stack overflow";
      goto LAB_0010ca7d;
    }
  }
  L->nCcalls = uVar7 + 1;
  bVar3 = luaD_rawrunprotected(L,resume,local_34);
  if (bVar3 < 2) {
LAB_0010cb18:
    uVar7 = (uint)bVar3;
LAB_0010cb21:
    if (bVar3 == 1) {
      aVar4 = L->ci->u2;
      goto LAB_0010cb52;
    }
  }
  else {
    while( true ) {
      uVar7 = (uint)bVar3;
      pCVar6 = L->ci;
      if (pCVar6 == (CallInfo *)0x0) break;
      while (uVar2 = pCVar6->callstatus, (uVar2 >> 0x15 & 1) == 0) {
        pCVar6 = pCVar6->previous;
        if (pCVar6 == (CallInfo *)0x0) {
          if (1 < bVar3) goto LAB_0010cb2e;
          goto LAB_0010cb21;
        }
      }
      L->ci = pCVar6;
      pCVar6->callstatus = (uint)bVar3 << 0xc | uVar2 & 0xffff8fff;
      bVar3 = luaD_rawrunprotected(L,unroll,(void *)0x0);
      if (bVar3 < 2) goto LAB_0010cb18;
    }
LAB_0010cb2e:
    lua_resume_cold_1();
  }
  aVar4.funcidx = (int)((ulong)((long)(L->top).p + (-0x10 - (L->ci->func).offset)) >> 4);
LAB_0010cb52:
  *nresults = (int)aVar4;
  return uVar7;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs,
                                      int *nresults) {
  TStatus status;
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
    else if (L->top.p - (L->ci->func.p + 1) == nargs)  /* no function? */
      return resume_error(L, "cannot resume dead coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)  /* ended with errors? */
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  if (getCcalls(L) >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  L->nCcalls++;
  luai_userstateresume(L, nargs);
  api_checkpop(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
   /* continue running after recoverable errors */
  status = precover(L, status);
  if (l_likely(!errorstatus(status)))
    lua_assert(status == L->status);  /* normal end or yield */
  else {  /* unrecoverable error */
    L->status = status;  /* mark thread as 'dead' */
    luaD_seterrorobj(L, status, L->top.p);  /* push error message */
    L->ci->top.p = L->top.p;
  }
  *nresults = (status == LUA_YIELD) ? L->ci->u2.nyield
                                    : cast_int(L->top.p - (L->ci->func.p + 1));
  lua_unlock(L);
  return APIstatus(status);
}